

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STParsedJSON.cpp
# Opt level: O2

optional<jbcoin::detail::STVar> *
jbcoin::STParsedJSONDetail::parseArray
          (optional<jbcoin::detail::STVar> *__return_storage_ptr__,string *json_name,Value *json,
          SField *inName,int depth,Value *error)

{
  ushort uVar1;
  char cVar2;
  UInt UVar3;
  UInt UVar4;
  Value *pVVar5;
  SField *inName_00;
  ostream *poVar6;
  pointer_type pSVar7;
  reference_type __args;
  STArray *args;
  STArray *this;
  ulong uVar8;
  string errMsg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  Value objectFields;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  optional<jbcoin::STObject> ret;
  string objectName;
  STArray tail;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  Value local_1c8;
  stringstream ss;
  ostream local_1a8;
  
  if ((json->field_0x8 == '\0') || (json->field_0x8 == '\x06')) {
    if (depth < 0x41) {
      STArray::STArray(&tail,inName);
      uVar8 = 0;
      do {
        UVar3 = Json::Value::size(json);
        if (UVar3 <= uVar8) {
          detail::make_stvar<jbcoin::STArray,jbcoin::STArray>((STVar *)&ss,(detail *)&tail,args);
          boost::optional_detail::optional_base<jbcoin::detail::STVar>::optional_base
                    (&__return_storage_ptr__->super_type,&ss);
          detail::STVar::~STVar((STVar *)&ss);
LAB_001dca83:
          STArray::~STArray(&tail);
          return __return_storage_ptr__;
        }
        UVar3 = (UInt)uVar8;
        pVVar5 = Json::Value::operator[](json,UVar3);
        uVar1 = *(ushort *)&pVVar5->field_0x8;
        cVar2 = (char)uVar1;
        if ((cVar2 != '\a') && (cVar2 != '\0')) {
LAB_001dc6f0:
          std::operator+(&local_2f8,"Field \'",json_name);
          std::operator+(&local_2d8,&local_2f8,"[");
          std::__cxx11::to_string((string *)&ss,UVar3);
          std::operator+(&errMsg,&local_2d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret,
                         &errMsg,"]\' must be an object with a single key/object value.");
          RPC::make_error((RPC *)&local_2a8,rpcINVALID_PARAMS,(string *)&ret);
          std::__cxx11::string::~string((string *)&ret);
          std::__cxx11::string::~string((string *)&errMsg);
          std::__cxx11::string::~string((string *)&ss);
          std::__cxx11::string::~string((string *)&local_2d8);
          std::__cxx11::string::~string((string *)&local_2f8);
          Json::Value::swap(error,(Value *)&local_2a8);
          Json::Value::~Value((Value *)&local_2a8);
          (__return_storage_ptr__->super_type).m_initialized = false;
          goto LAB_001dca83;
        }
        pVVar5 = Json::Value::operator[](json,UVar3);
        UVar4 = Json::Value::size(pVVar5);
        if (!(bool)(~(cVar2 != '\0' && (uVar1 & 0xff) != 7) & UVar4 == 1)) goto LAB_001dc6f0;
        pVVar5 = Json::Value::operator[](json,UVar3);
        Json::Value::getMemberNames_abi_cxx11_((Members *)&ss,pVVar5);
        std::__cxx11::string::string((string *)&objectName,(string *)_ss);
        beast::unit_test::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&ss);
        inName_00 = SField::getField(&objectName);
        if (inName_00->fieldCode == sfInvalid) {
          unknown_field((STParsedJSONDetail *)&ss,json_name,&objectName);
          Json::Value::swap(error,(Value *)&ss);
          Json::Value::~Value((Value *)&ss);
          (__return_storage_ptr__->super_type).m_initialized = false;
LAB_001dca76:
          std::__cxx11::string::~string((string *)&objectName);
          goto LAB_001dca83;
        }
        pVVar5 = Json::Value::operator[](json,UVar3);
        pVVar5 = Json::Value::operator[](pVVar5,objectName._M_dataplus._M_p);
        Json::Value::Value(&objectFields,pVVar5);
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        poVar6 = std::operator<<(&local_1a8,(string *)json_name);
        poVar6 = std::operator<<(poVar6,".");
        poVar6 = std::operator<<(poVar6,"[");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(poVar6,"].");
        std::operator<<(poVar6,(string *)&objectName);
        std::__cxx11::stringbuf::str();
        parseObject(&ret,&errMsg,&objectFields,inName_00,depth + 1,error);
        std::__cxx11::string::~string((string *)&errMsg);
        if (ret.super_type.m_initialized == false) {
          pVVar5 = Json::Value::operator[](error,"error_message");
          Json::Value::asString_abi_cxx11_(&errMsg,pVVar5);
          std::__cxx11::stringbuf::str();
          std::operator+(&local_2a8,"Error at \'",&local_288);
          std::operator+(&local_2f8,&local_2a8,"\'. ");
          std::operator+(&local_2d8,&local_2f8,&errMsg);
          Json::Value::Value((Value *)&local_1e8,&local_2d8);
          pVVar5 = Json::Value::operator[](error,"error_message");
          Json::Value::swap(pVVar5,(Value *)&local_1e8);
          Json::Value::~Value((Value *)&local_1e8);
          std::__cxx11::string::~string((string *)&local_2d8);
          std::__cxx11::string::~string((string *)&local_2f8);
          std::__cxx11::string::~string((string *)&local_2a8);
          std::__cxx11::string::~string((string *)&local_288);
          (__return_storage_ptr__->super_type).m_initialized = false;
          std::__cxx11::string::~string((string *)&errMsg);
LAB_001dca4f:
          boost::optional_detail::optional_base<jbcoin::STObject>::~optional_base(&ret.super_type);
          std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
          Json::Value::~Value(&objectFields);
          goto LAB_001dca76;
        }
        pSVar7 = boost::optional<jbcoin::STObject>::operator->(&ret);
        if (((pSVar7->super_STBase).fName)->fieldType != STI_OBJECT) {
          std::__cxx11::stringbuf::str();
          std::operator+(&local_2a8,"Item \'",&local_1e8);
          std::operator+(&local_2f8,&local_2a8,"\' at index ");
          std::__cxx11::to_string(&local_288,UVar3);
          std::operator+(&local_2d8,&local_2f8,&local_288);
          std::operator+(&errMsg,&local_2d8," is not an object.  Arrays may only contain objects.");
          RPC::make_error((RPC *)&local_1c8,rpcINVALID_PARAMS,&errMsg);
          std::__cxx11::string::~string((string *)&errMsg);
          std::__cxx11::string::~string((string *)&local_2d8);
          std::__cxx11::string::~string((string *)&local_288);
          std::__cxx11::string::~string((string *)&local_2f8);
          std::__cxx11::string::~string((string *)&local_2a8);
          Json::Value::swap(error,&local_1c8);
          Json::Value::~Value(&local_1c8);
          std::__cxx11::string::~string((string *)&local_1e8);
          (__return_storage_ptr__->super_type).m_initialized = false;
          goto LAB_001dca4f;
        }
        __args = boost::optional<jbcoin::STObject>::get(&ret);
        std::vector<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>::
        emplace_back<jbcoin::STObject>(&tail.v_,__args);
        boost::optional_detail::optional_base<jbcoin::STObject>::~optional_base(&ret.super_type);
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        Json::Value::~Value(&objectFields);
        std::__cxx11::string::~string((string *)&objectName);
        uVar8 = uVar8 + 1;
      } while( true );
    }
    this = (STArray *)&ss;
    too_deep((STParsedJSONDetail *)this,json_name);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret,
                   "Field \'",json_name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret,
                   "\' is not a JSON array.");
    RPC::make_error((RPC *)&tail,rpcINVALID_PARAMS,(string *)&ss);
    std::__cxx11::string::~string((string *)&ss);
    std::__cxx11::string::~string((string *)&ret);
    this = &tail;
  }
  Json::Value::swap(error,(Value *)this);
  Json::Value::~Value((Value *)this);
  (__return_storage_ptr__->super_type).m_initialized = false;
  return __return_storage_ptr__;
}

Assistant:

static boost::optional <detail::STVar> parseArray (
    std::string const& json_name,
    Json::Value const& json,
    SField const& inName,
    int depth,
    Json::Value& error)
{
    if (! json.isArray ())
    {
        error = not_an_array (json_name);
        return boost::none;
    }

    if (depth > maxDepth)
    {
        error = too_deep (json_name);
        return boost::none;
    }

    try
    {
        STArray tail (inName);

        for (Json::UInt i = 0; json.isValidIndex (i); ++i)
        {
            bool const isObject (json[i].isObject());
            bool const singleKey (isObject ? json[i].size() == 1 : true);

            if (!isObject || !singleKey)
            {
                error = singleton_expected (json_name, i);
                return boost::none;
            }

            // TODO: There doesn't seem to be a nice way to get just the
            // first/only key in an object without copying all keys into
            // a vector
            std::string const objectName (json[i].getMemberNames()[0]);;
            auto const&       nameField (SField::getField(objectName));

            if (nameField == sfInvalid)
            {
                error = unknown_field (json_name, objectName);
                return boost::none;
            }

            Json::Value const objectFields (json[i][objectName]);

            std::stringstream ss;
            ss << json_name << "." <<
                "[" << i << "]." << objectName;

            auto ret = parseObject (ss.str (), objectFields,
                nameField, depth + 1, error);
            if (! ret)
            {
                    std::string errMsg = error["error_message"].asString ();
                    error["error_message"] = "Error at '" + ss.str () +
                        "'. " + errMsg;
                    return boost::none;
            }

            if (ret->getFName().fieldType != STI_OBJECT)
            {
                error = non_object_in_array (ss.str(), i);
                return boost::none;
            }

            tail.push_back (std::move (*ret));
        }

        return detail::make_stvar <STArray> (std::move (tail));
    }
    catch (std::exception const&)
    {
        error = invalid_data (json_name);
        return boost::none;
    }
}